

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalSerialize
          (GeneratedCodeInfo_Annotation *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  anon_union_56_1_493b367e_for_GeneratedCodeInfo_Annotation_10 aVar2;
  int iVar3;
  uint8_t *puVar4;
  const_pointer piVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  char *in_R9;
  undefined8 *puVar9;
  string_view s;
  string_view field_name;
  LogMessageFatal local_40;
  
  uVar8 = *(uint *)((long)&this->field_0 + 0x18);
  if (0 < (int)uVar8) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    this_00 = &(this->field_0)._impl_.path_;
    *puVar4 = '\n';
    target = puVar4 + 2;
    for (; 0x7f < uVar8; uVar8 = uVar8 >> 7) {
      target[-1] = (byte)uVar8 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar8;
    piVar5 = RepeatedField<int>::data(this_00);
    iVar3 = RepeatedField<int>::size(this_00);
    piVar1 = piVar5 + iVar3;
    do {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar7 = (ulong)*piVar5; target = pbVar6 + 1, 0x7f < uVar7; uVar7 = uVar7 >> 7) {
        *pbVar6 = (byte)uVar7 | 0x80;
        pbVar6 = target;
      }
      piVar5 = piVar5 + 1;
      *pbVar6 = (byte)uVar7;
    } while (piVar5 < piVar1);
  }
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    puVar9 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.source_file_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.GeneratedCodeInfo.Annotation.source_file";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar9,(char *)(ulong)*(uint *)(puVar9 + 1),1,0x38,field_name);
    s._M_str = (char *)*puVar9;
    s._M_len = puVar9[1];
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.begin_,target);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                       (stream,(this->field_0)._impl_.end_,target);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray(5,(this->field_0)._impl_.semantic_,puVar4);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL GeneratedCodeInfo_Annotation::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const GeneratedCodeInfo_Annotation& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string source_file = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_source_file();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional int32 begin = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_begin(), target);
  }

  // optional int32 end = 4;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_end(), target);
  }

  // optional .google.protobuf.GeneratedCodeInfo.Annotation.Semantic semantic = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_semantic(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}